

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

int cuddEstimateCofactorSimple(DdNode *node,int i)

{
  int iVar1;
  DdNode *pDVar2;
  int iVar3;
  
  pDVar2 = node->next;
  iVar3 = 0;
  if (((ulong)pDVar2 & 1) == 0) {
    iVar3 = 0;
    do {
      node->next = (DdNode *)((ulong)pDVar2 | 1);
      if (node->index == 0x7fffffff) {
        iVar1 = 1;
        goto LAB_008025a9;
      }
      iVar1 = cuddEstimateCofactorSimple((node->type).kids.T,i);
      if (node->index == i) goto LAB_008025a9;
      node = (DdNode *)((ulong)(node->type).kids.E & 0xfffffffffffffffe);
      iVar3 = iVar3 + iVar1 + 1;
      pDVar2 = node->next;
    } while (((ulong)pDVar2 & 1) == 0);
    iVar1 = 0;
LAB_008025a9:
    iVar3 = iVar3 + iVar1;
  }
  return iVar3;
}

Assistant:

static int
cuddEstimateCofactorSimple(
  DdNode * node,
  int i)
{
    int tval, eval;

    if (Cudd_IsComplement(node->next)) {
        return(0);
    }
    node->next = Cudd_Not(node->next);
    if (cuddIsConstant(node)) {
        return(1);
    }
    tval = cuddEstimateCofactorSimple(cuddT(node),i);
    if ((int) node->index == i) return(tval);
    eval = cuddEstimateCofactorSimple(Cudd_Regular(cuddE(node)),i);
    return(1 + tval + eval);

}